

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish_test.cc
# Opt level: O3

void __thiscall Blowfish_CBC_Test::TestBody(Blowfish_CBC_Test *this)

{
  _Alloc_hider _Var1;
  int iVar2;
  EVP_CIPHER *pEVar3;
  char *pcVar4;
  char *in_R9;
  BlowfishTestCase *key;
  pointer pcVar5;
  ScopedTrace gtest_trace_103;
  int out_bytes;
  int final_bytes;
  uint test_num;
  ScopedEVP_CIPHER_CTX decrypt_ctx;
  uint8_t out [24];
  ScopedEVP_CIPHER_CTX ctx;
  ScopedTrace local_1d9;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  undefined1 local_1c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  Bytes local_1a8;
  int local_194;
  AssertHelper local_190;
  int local_188;
  uint local_184;
  undefined1 local_180 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170 [8];
  AssertHelperData local_e8 [3];
  
  local_184 = 0;
  key = kTests;
  pcVar5 = (pointer)0xc0;
  do {
    local_184 = local_184 + 1;
    testing::ScopedTrace::ScopedTrace<unsigned_int>
              (&local_1d9,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
               ,0x67,&local_184);
    EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&local_e8[0].message._M_string_length);
    pEVar3 = EVP_bf_cbc();
    iVar2 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)&local_e8[0].message._M_string_length,pEVar3,
                               (ENGINE *)0x0,key->key,key->iv);
    local_1c8[0] = (internal)(iVar2 != 0);
    local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_1d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_180,(internal *)local_1c8,
                 (AssertionResult *)
                 "EVP_EncryptInit_ex(ctx.get(), EVP_bf_cbc(), nullptr, test.key, test.iv)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x6e,(char *)CONCAT71(local_180._1_7_,local_180[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_1d8);
LAB_0012007b:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_180._1_7_,local_180[0]) != local_170) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_180._1_7_,local_180[0]),
                        local_170[0]._M_allocated_capacity + 1);
      }
      if (local_1d8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
      }
      if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1c0,local_1c0);
      }
      EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_e8[0].message._M_string_length);
LAB_001201f4:
      testing::ScopedTrace::~ScopedTrace(&local_1d9);
      return;
    }
    local_e8[0].message._M_dataplus._M_p = pcVar5;
    iVar2 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)&local_e8[0].message._M_string_length,
                              (uchar *)local_e8,&local_194,key->plaintext,0x10);
    local_1c8[0] = (internal)(iVar2 != 0);
    local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_1d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_180,(internal *)local_1c8,
                 (AssertionResult *)
                 "EVP_EncryptUpdate(ctx.get(), out, &out_bytes, test.plaintext, sizeof(test.plaintext))"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x70,(char *)CONCAT71(local_180._1_7_,local_180[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_1d8);
      goto LAB_0012007b;
    }
    iVar2 = EVP_EncryptFinal_ex((EVP_CIPHER_CTX *)&local_e8[0].message._M_string_length,
                                (uchar *)((long)&local_e8[0].type + (long)local_194),&local_188);
    local_1c8[0] = (internal)(iVar2 != 0);
    local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_1d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_180,(internal *)local_1c8,
                 (AssertionResult *)"EVP_EncryptFinal_ex(ctx.get(), out + out_bytes, &final_bytes)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x71,(char *)CONCAT71(local_180._1_7_,local_180[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_1d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_180._1_7_,local_180[0]) != local_170) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_180._1_7_,local_180[0]),
                        local_170[0]._M_allocated_capacity + 1);
      }
      if (local_1d8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
      }
      if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1c0,local_1c0);
      }
    }
    local_1c8 = (undefined1  [8])((long)local_188 + (long)local_194);
    local_1d8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_180,"static_cast<size_t>(out_bytes + final_bytes)",
               "sizeof(test.cbc_ciphertext)",(unsigned_long *)local_1c8,(unsigned_long *)&local_1d8)
    ;
    if (local_180[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1c8);
      pcVar4 = "";
      if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = (local_178->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x73,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)local_1c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
      if (local_1c8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_1c8 + 8))();
      }
    }
    if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_178,local_178);
    }
    local_1c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000018;
    local_1d8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8;
    local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x18;
    local_1c8 = (undefined1  [8])key->cbc_ciphertext;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_180,"Bytes(test.cbc_ciphertext)","Bytes(out)",(Bytes *)local_1c8,
               (Bytes *)&local_1d8);
    if (local_180[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1c8);
      pcVar4 = "";
      if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = (local_178->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x74,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)local_1c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
      if (local_1c8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_1c8 + 8))();
      }
    }
    if (local_178 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_178,local_178);
    }
    EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)local_180);
    pEVar3 = EVP_bf_cbc();
    iVar2 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)local_180,pEVar3,(ENGINE *)0x0,key->key,key->iv);
    local_1d8._M_head_impl._0_1_ = iVar2 != 0;
    local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_1a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1c8,(internal *)&local_1d8,
                 (AssertionResult *)
                 "EVP_DecryptInit_ex(decrypt_ctx.get(), EVP_bf_cbc(), nullptr, test.key, test.iv)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x78,(char *)local_1c8);
      testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1a8);
LAB_00120193:
      testing::internal::AssertHelper::~AssertHelper(&local_190);
      if (local_1c8 != (undefined1  [8])&local_1b8) {
        operator_delete((void *)local_1c8,local_1b8._M_allocated_capacity + 1);
      }
      if ((AssertHelperData *)local_1a8.span_.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_1a8.span_.data_ + 8))();
      }
      if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1d0,local_1d0);
      }
      EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)local_180);
      EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_e8[0].message._M_string_length);
      goto LAB_001201f4;
    }
    iVar2 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)local_180,(uchar *)local_e8,&local_194,
                              key->cbc_ciphertext,0x18);
    local_1d8._M_head_impl._0_1_ = iVar2 != 0;
    local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_1a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1c8,(internal *)&local_1d8,
                 (AssertionResult *)
                 "EVP_DecryptUpdate(decrypt_ctx.get(), out, &out_bytes, test.cbc_ciphertext, sizeof(test.cbc_ciphertext))"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x7b,(char *)local_1c8);
      testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1a8);
      goto LAB_00120193;
    }
    iVar2 = EVP_DecryptFinal_ex((EVP_CIPHER_CTX *)local_180,
                                (uchar *)((long)&local_e8[0].type + (long)local_194),&local_188);
    local_1d8._M_head_impl._0_1_ = iVar2 != 0;
    local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_1a8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_1c8,(internal *)&local_1d8,
                 (AssertionResult *)
                 "EVP_DecryptFinal_ex(decrypt_ctx.get(), out + out_bytes, &final_bytes)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_190,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x7d,(char *)local_1c8);
      testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1a8);
      testing::internal::AssertHelper::~AssertHelper(&local_190);
      if (local_1c8 != (undefined1  [8])&local_1b8) {
        operator_delete((void *)local_1c8,local_1b8._M_allocated_capacity + 1);
      }
      if ((AssertHelperData *)local_1a8.span_.data_ != (AssertHelperData *)0x0) {
        (**(code **)(*(long *)local_1a8.span_.data_ + 8))();
      }
      if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1d0,local_1d0);
      }
    }
    local_1d8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)local_188 + (long)local_194);
    local_1a8.span_.data_ = &DAT_00000010;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_1c8,"static_cast<size_t>(out_bytes + final_bytes)",
               "sizeof(test.plaintext)",(unsigned_long *)&local_1d8,(unsigned_long *)&local_1a8);
    if (local_1c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1d8);
      pcVar4 = "";
      if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = (local_1c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x7f,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_1d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
      if (local_1d8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
      }
    }
    if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1c0,local_1c0);
    }
    local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000010;
    local_1a8.span_.size_ = (long)local_188 + (long)local_194;
    local_1a8.span_.data_ = (uchar *)local_e8;
    local_1d8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)key->plaintext;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_1c8,"Bytes(test.plaintext)","Bytes(out, out_bytes + final_bytes)",
               (Bytes *)&local_1d8,&local_1a8);
    _Var1._M_p = local_e8[0].message._M_dataplus._M_p;
    if (local_1c8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1d8);
      pcVar4 = "";
      if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar4 = (local_1c0->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x80,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1a8,(Message *)&local_1d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1a8);
      if (local_1d8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1d8._M_head_impl + 8))();
      }
    }
    if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1c0,local_1c0);
    }
    EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)local_180);
    EVP_CIPHER_CTX_cleanup((EVP_CIPHER_CTX *)&local_e8[0].message._M_string_length);
    testing::ScopedTrace::~ScopedTrace(&local_1d9);
    key = key + 1;
    pcVar5 = _Var1._M_p + -0x60;
    if (pcVar5 == (pointer)0x0) {
      return;
    }
  } while( true );
}

Assistant:

TEST(Blowfish, CBC) {
  unsigned test_num = 0;
  for (const auto &test : kTests) {
    test_num++;
    SCOPED_TRACE(test_num);

    uint8_t out[sizeof(test.cbc_ciphertext)];
    int out_bytes, final_bytes;

    bssl::ScopedEVP_CIPHER_CTX ctx;
    ASSERT_TRUE(EVP_EncryptInit_ex(ctx.get(), EVP_bf_cbc(), nullptr, test.key,
                                   test.iv));
    ASSERT_TRUE(EVP_EncryptUpdate(ctx.get(), out, &out_bytes, test.plaintext,
                                  sizeof(test.plaintext)));
    EXPECT_TRUE(EVP_EncryptFinal_ex(ctx.get(), out + out_bytes, &final_bytes));
    EXPECT_EQ(static_cast<size_t>(out_bytes + final_bytes),
              sizeof(test.cbc_ciphertext));
    EXPECT_EQ(Bytes(test.cbc_ciphertext), Bytes(out));

    bssl::ScopedEVP_CIPHER_CTX decrypt_ctx;
    ASSERT_TRUE(EVP_DecryptInit_ex(decrypt_ctx.get(), EVP_bf_cbc(), nullptr,
                                   test.key, test.iv));
    ASSERT_TRUE(EVP_DecryptUpdate(decrypt_ctx.get(), out, &out_bytes,
                                  test.cbc_ciphertext,
                                  sizeof(test.cbc_ciphertext)));
    EXPECT_TRUE(
        EVP_DecryptFinal_ex(decrypt_ctx.get(), out + out_bytes, &final_bytes));
    EXPECT_EQ(static_cast<size_t>(out_bytes + final_bytes),
              sizeof(test.plaintext));
    EXPECT_EQ(Bytes(test.plaintext), Bytes(out, out_bytes + final_bytes));
  }
}